

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

pid_t absl::lts_20240722::base_internal::GetCachedTID(void)

{
  pid_t pVar1;
  pid_t *ppVar2;
  
  ppVar2 = (pid_t *)__tls_get_addr(&PTR_00105fb0);
  if ((char)ppVar2[1] != '\x01') {
    pVar1 = GetTID();
    *ppVar2 = pVar1;
    *(undefined1 *)(ppVar2 + 1) = 1;
  }
  return *ppVar2;
}

Assistant:

pid_t GetCachedTID() {
#ifdef ABSL_HAVE_THREAD_LOCAL
  static thread_local pid_t thread_id = GetTID();
  return thread_id;
#else
  return GetTID();
#endif  // ABSL_HAVE_THREAD_LOCAL
}